

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpudpv6transmitter.cpp
# Opt level: O0

void __thiscall jrtplib::RTPUDPv6Transmitter::LeaveAllMulticastGroups(RTPUDPv6Transmitter *this)

{
  undefined8 uVar1;
  undefined8 uVar2;
  bool bVar3;
  in6_addr *piVar4;
  undefined8 local_4c;
  ipv6_mreq mreq_1;
  ipv6_mreq mreq;
  int status;
  in6_addr mcastIP;
  RTPUDPv6Transmitter *this_local;
  
  if (((this->init & 1U) != 0) && ((this->created & 1U) != 0)) {
    RTPHashTable<const_in6_addr,_jrtplib::RTPUDPv6Trans_GetHashIndex_in6_addr,_8317>::
    GotoFirstElement(&this->multicastgroups);
    while (bVar3 = RTPHashTable<const_in6_addr,_jrtplib::RTPUDPv6Trans_GetHashIndex_in6_addr,_8317>
                   ::HasCurrentElement(&this->multicastgroups), bVar3) {
      piVar4 = RTPHashTable<const_in6_addr,_jrtplib::RTPUDPv6Trans_GetHashIndex_in6_addr,_8317>::
               GetCurrentElement(&this->multicastgroups);
      uVar1 = *(undefined8 *)&piVar4->__in6_u;
      uVar2 = *(undefined8 *)((long)&piVar4->__in6_u + 8);
      mreq_1._12_8_ = uVar1;
      setsockopt(this->rtpsock,0x29,0x15,(void *)((long)&mreq_1.ipv6mr_multiaddr.__in6_u + 0xc),0x14
                );
      mreq_1.ipv6mr_multiaddr.__in6_u.__u6_addr32[2] = this->mcastifidx;
      local_4c = uVar1;
      mreq_1.ipv6mr_multiaddr.__in6_u._0_8_ = uVar2;
      setsockopt(this->rtcpsock,0x29,0x15,&local_4c,0x14);
      RTPHashTable<const_in6_addr,_jrtplib::RTPUDPv6Trans_GetHashIndex_in6_addr,_8317>::
      GotoNextElement(&this->multicastgroups);
    }
    RTPHashTable<const_in6_addr,_jrtplib::RTPUDPv6Trans_GetHashIndex_in6_addr,_8317>::Clear
              (&this->multicastgroups);
  }
  return;
}

Assistant:

void RTPUDPv6Transmitter::LeaveAllMulticastGroups()
{
	if (!init)
		return;
	
	MAINMUTEX_LOCK
	if (created)
	{
		multicastgroups.GotoFirstElement();
		while (multicastgroups.HasCurrentElement())
		{
			in6_addr mcastIP;
			int status = 0;

			mcastIP = multicastgroups.GetCurrentElement();
			RTPUDPV6TRANS_MCASTMEMBERSHIP(rtpsock,IPV6_LEAVE_GROUP,mcastIP,status);
			RTPUDPV6TRANS_MCASTMEMBERSHIP(rtcpsock,IPV6_LEAVE_GROUP,mcastIP,status);
			multicastgroups.GotoNextElement();
			JRTPLIB_UNUSED(status);
		}
		multicastgroups.Clear();
	}
	MAINMUTEX_UNLOCK
}